

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O2

void psa_format_key_data_for_storage
               (uint8_t *data,size_t data_length,psa_core_key_attributes_t *attr,
               uint8_t *storage_data)

{
  storage_data[0] = 'P';
  storage_data[1] = 'S';
  storage_data[2] = 'A';
  storage_data[3] = '\0';
  storage_data[4] = 'K';
  storage_data[5] = 'E';
  storage_data[6] = 'Y';
  storage_data[7] = '\0';
  storage_data[8] = '\0';
  storage_data[9] = '\0';
  storage_data[10] = '\0';
  storage_data[0xb] = '\0';
  storage_data[0xc] = (uint8_t)attr->lifetime;
  storage_data[0xd] = *(uint8_t *)((long)&attr->lifetime + 1);
  storage_data[0xe] = *(uint8_t *)((long)&attr->lifetime + 2);
  storage_data[0xf] = *(uint8_t *)((long)&attr->lifetime + 3);
  storage_data[0x10] = (uint8_t)attr->type;
  storage_data[0x11] = *(uint8_t *)((long)&attr->type + 1);
  storage_data[0x12] = '\0';
  storage_data[0x13] = '\0';
  storage_data[0x14] = (uint8_t)(attr->policy).usage;
  storage_data[0x15] = *(uint8_t *)((long)&(attr->policy).usage + 1);
  storage_data[0x16] = *(uint8_t *)((long)&(attr->policy).usage + 2);
  storage_data[0x17] = *(uint8_t *)((long)&(attr->policy).usage + 3);
  storage_data[0x18] = (uint8_t)(attr->policy).alg;
  storage_data[0x19] = *(uint8_t *)((long)&(attr->policy).alg + 1);
  storage_data[0x1a] = *(uint8_t *)((long)&(attr->policy).alg + 2);
  storage_data[0x1b] = *(uint8_t *)((long)&(attr->policy).alg + 3);
  storage_data[0x1c] = (uint8_t)(attr->policy).alg2;
  storage_data[0x1d] = *(uint8_t *)((long)&(attr->policy).alg2 + 1);
  storage_data[0x1e] = *(uint8_t *)((long)&(attr->policy).alg2 + 2);
  storage_data[0x1f] = *(uint8_t *)((long)&(attr->policy).alg2 + 3);
  storage_data[0x20] = (uint8_t)data_length;
  storage_data[0x21] = (uint8_t)(data_length >> 8);
  storage_data[0x22] = (uint8_t)(data_length >> 0x10);
  storage_data[0x23] = (uint8_t)(data_length >> 0x18);
  memcpy(storage_data + 0x24,data,data_length);
  return;
}

Assistant:

void psa_format_key_data_for_storage( const uint8_t *data,
                                      const size_t data_length,
                                      const psa_core_key_attributes_t *attr,
                                      uint8_t *storage_data )
{
    psa_persistent_key_storage_format *storage_format =
        (psa_persistent_key_storage_format *) storage_data;

    memcpy( storage_format->magic, PSA_KEY_STORAGE_MAGIC_HEADER, PSA_KEY_STORAGE_MAGIC_HEADER_LENGTH );
    PUT_UINT32_LE( 0, storage_format->version, 0 );
    PUT_UINT32_LE( attr->lifetime, storage_format->lifetime, 0 );
    PUT_UINT32_LE( (uint32_t) attr->type, storage_format->type, 0 );
    PUT_UINT32_LE( attr->policy.usage, storage_format->policy, 0 );
    PUT_UINT32_LE( attr->policy.alg, storage_format->policy, sizeof( uint32_t ) );
    PUT_UINT32_LE( attr->policy.alg2, storage_format->policy, 2 * sizeof( uint32_t ) );
    PUT_UINT32_LE( data_length, storage_format->data_len, 0 );
    memcpy( storage_format->key_data, data, data_length );
}